

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_sadb_aarch64(uint64_t a,uint64_t b)

{
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  ushort uVar4;
  byte bVar5;
  byte bVar6;
  undefined4 local_54;
  undefined4 local_4c;
  undefined4 local_44;
  undefined4 local_3c;
  undefined4 local_34;
  undefined4 local_2c;
  undefined4 local_24;
  undefined4 local_1c;
  uint64_t b_local;
  uint64_t a_local;
  
  uVar1 = (uint)a;
  uVar2 = (uint)b;
  if ((int)((uVar1 & 0xff) - (uVar2 & 0xff)) < 0) {
    local_1c = -(uVar2 & 0xff) - (uVar1 & 0xff);
  }
  else {
    local_1c = (uVar1 & 0xff) - (uVar2 & 0xff);
  }
  uVar1 = (uint)(a >> 8);
  uVar2 = (uint)(b >> 8);
  if ((int)((uVar1 & 0xff) - (uVar2 & 0xff)) < 0) {
    local_24 = -(uVar2 & 0xff) - (uVar1 & 0xff);
  }
  else {
    local_24 = (uVar1 & 0xff) - (uVar2 & 0xff);
  }
  uVar1 = (uint)(a >> 0x10);
  uVar2 = (uint)(b >> 0x10);
  if ((int)((uVar1 & 0xff) - (uVar2 & 0xff)) < 0) {
    local_2c = -(uVar2 & 0xff) - (uVar1 & 0xff);
  }
  else {
    local_2c = (uVar1 & 0xff) - (uVar2 & 0xff);
  }
  uVar1 = (uint)(a >> 0x18);
  uVar2 = (uint)(b >> 0x18);
  if ((int)((uVar1 & 0xff) - (uVar2 & 0xff)) < 0) {
    local_34 = -(uVar2 & 0xff) - (uVar1 & 0xff);
  }
  else {
    local_34 = (uVar1 & 0xff) - (uVar2 & 0xff);
  }
  uVar1 = (uint)(a >> 0x20);
  uVar2 = (uint)(b >> 0x20);
  if ((int)((uVar1 & 0xff) - (uVar2 & 0xff)) < 0) {
    local_3c = -(uVar2 & 0xff) - (uVar1 & 0xff);
  }
  else {
    local_3c = (uVar1 & 0xff) - (uVar2 & 0xff);
  }
  if ((int)((uVar1 >> 8 & 0xff) - (uVar2 >> 8 & 0xff)) < 0) {
    local_44 = -(uVar2 >> 8 & 0xff) - (uVar1 >> 8 & 0xff);
  }
  else {
    local_44 = (uVar1 >> 8 & 0xff) - (uVar2 >> 8 & 0xff);
  }
  uVar3 = (ushort)(a >> 0x30);
  uVar4 = (ushort)(b >> 0x30);
  if ((int)((uVar3 & 0xff) - (uVar4 & 0xff)) < 0) {
    local_4c = -(uVar4 & 0xff) - (uVar3 & 0xff);
  }
  else {
    local_4c = (uVar3 & 0xff) - (uVar4 & 0xff);
  }
  bVar5 = (byte)(a >> 0x38);
  bVar6 = (byte)(b >> 0x38);
  if ((int)((uint)bVar5 - (uint)bVar6) < 0) {
    local_54 = -(uint)bVar6 - (uint)bVar5;
  }
  else {
    local_54 = (uint)bVar5 - (uint)bVar6;
  }
  return (long)(local_1c + local_24 + local_2c + local_34 + local_3c + local_44 + local_4c +
               local_54);
}

Assistant:

uint64_t HELPER(iwmmxt_sadb)(uint64_t a, uint64_t b)
{
#define abs(x) (((x) >= 0) ? x : -x)
#define SADB(SHR) abs((int) ((a >> SHR) & 0xff) - (int) ((b >> SHR) & 0xff))
    return
        SADB(0) + SADB(8) + SADB(16) + SADB(24) +
        SADB(32) + SADB(40) + SADB(48) + SADB(56);
#undef SADB
}